

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_d2ed1c::HandleSetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  NormalizeOption NVar2;
  int iVar3;
  string_view value;
  cmCMakePath path;
  path local_90;
  path local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((long)(args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 5U <
      0xfffffffffffffffe) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"SET must be called with two or three arguments.",
               (allocator<char> *)&local_68);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else if (pbVar1[1]._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Invalid name for path variable.",(allocator<char> *)&local_68);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (((anonymous_namespace)::
         HandleSetCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::parser == '\0') &&
       (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleSetCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::parser), iVar3 != 0)) {
      NormalizeParser::NormalizeParser(&HandleSetCommand::parser);
      __cxa_atexit(CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::
                   ~CMakePathArgumentParser,&HandleSetCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleSetCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
    NVar2 = CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::Parse<2>
                      (&HandleSetCommand::parser.
                        super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>,args);
    if ((long)HandleSetCommand::parser.
              super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)HandleSetCommand::parser.
              super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20) {
      std::__cxx11::string::string
                ((string *)&local_40,
                 (string *)
                 HandleSetCommand::parser.
                 super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                ((cmCMakePath *)&local_90,&local_40,native_format);
      std::__cxx11::string::~string((string *)&local_40);
      if ((NVar2.Normalize & 1U) != 0) {
        cmCMakePath::Normal((cmCMakePath *)&local_68,(cmCMakePath *)&local_90);
        cmCMakePath::operator=((cmCMakePath *)&local_90,(cmCMakePath *)&local_68);
        std::filesystem::__cxx11::path::~path(&local_68);
      }
      this = status->Makefile;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::filesystem::__cxx11::path::generic_string(&local_68._M_pathname,&local_90);
      value._M_str = local_68._M_pathname._M_dataplus._M_p;
      value._M_len = local_68._M_pathname._M_string_length;
      cmMakefile::AddDefinition(this,pbVar1 + 1,value);
      std::__cxx11::string::~string((string *)&local_68);
      std::filesystem::__cxx11::path::~path(&local_90);
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"SET called with unexpected arguments.",
               (allocator<char> *)&local_68);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&local_90);
  return false;
}

Assistant:

bool HandleSetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.size() < 3 || args.size() > 4) {
    status.SetError("SET must be called with two or three arguments.");
    return false;
  }

  if (args[1].empty()) {
    status.SetError("Invalid name for path variable.");
    return false;
  }

  static NormalizeParser const parser;

  const auto arguments = parser.Parse(args);

  if (parser.GetInputs().size() != 1) {
    status.SetError("SET called with unexpected arguments.");
    return false;
  }

  auto path =
    cmCMakePath(parser.GetInputs().front(), cmCMakePath::native_format);

  if (arguments.Normalize) {
    path = path.Normal();
  }

  status.GetMakefile().AddDefinition(args[1], path.GenericString());

  return true;
}